

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::
addEvent<std::vector<int,std::allocator<int>>&,std::array<int,3ul>&,std::forward_list<int,std::allocator<int>>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          vector<int,_std::allocator<int>_> *args,array<int,_3UL> *args_1,
          forward_list<int,_std::allocator<int>_> *args_2)

{
  QueueWriter *this_00;
  char **ppcVar1;
  Queue *pQVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  _Fwd_list_impl _Var6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  size_t sizes [5];
  long local_58 [5];
  
  local_58[0] = 8;
  local_58[1] = 8;
  local_58[2] = (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish +
                (4 - (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start);
  local_58[3] = 0x10;
  local_58[4] = 0;
  _Var6._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)args_2;
  do {
    _Var6._M_head._M_next =
         (_Fwd_list_node_base)((_Fwd_list_node_base *)_Var6._M_head._M_next)->_M_next;
    local_58[4] = local_58[4] + 4;
  } while ((_Fwd_list_impl)_Var6._M_head._M_next != (_Fwd_list_impl)0x0);
  lVar9 = 0;
  lVar3 = 0;
  do {
    lVar9 = lVar9 + *(long *)((long)local_58 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x28);
  uVar8 = lVar9 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar8) &&
       (sVar4 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar4 < uVar8)) &&
      (replaceChannel(this,uVar8),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar8)) &&
     (sVar4 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar4 < uVar8)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)lVar9;
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 4;
  *(uint64_t *)(pcVar7 + 4) = eventSourceId;
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 8;
  *(uint64_t *)(pcVar7 + 8) = clock;
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 8;
  uVar8 = (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  iVar5 = (int)(uVar8 >> 2);
  *(int *)(pcVar7 + 8) = iVar5;
  pcVar7 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar7;
  if (iVar5 != 0) {
    uVar8 = uVar8 & 0x3fffffffc;
    memcpy(pcVar7,(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start,uVar8);
    ppcVar1 = &(this->_qw)._writePos;
    *ppcVar1 = *ppcVar1 + uVar8;
  }
  pcVar7 = (this->_qw)._writePos;
  pcVar7[0] = '\x03';
  pcVar7[1] = '\0';
  pcVar7[2] = '\0';
  pcVar7[3] = '\0';
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 4;
  *(int *)(pcVar7 + 0xc) = args_1->_M_elems[2];
  *(undefined8 *)(pcVar7 + 4) = *(undefined8 *)args_1->_M_elems;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 0xc;
  mserialize::detail::BuiltinSerializer<std::forward_list<int,_std::allocator<int>_>,_void>::
  serialize<binlog::detail::QueueWriter>(args_2,this_00);
  pQVar2 = (this->_qw)._queue;
  (pQVar2->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar2->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}